

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O1

void fill_suite::back_inserter_fill_n_full(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  reference piVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  initializer_list<int> __l;
  basic_iterator<int> first_begin;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  allocator_type local_81;
  vector<int,_std::allocator<int>_> local_80;
  circular_view<int,_18446744073709551615UL> *local_68;
  size_type sStack_60;
  circular_view<int,_18446744073709551615UL> local_58;
  ulong local_38 [2];
  type local_28 [6];
  
  local_58.member.data = local_28;
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_58.member.cap = 4;
  local_58.member.size = 0;
  local_58.member.next = 4;
  lVar5 = -8;
  do {
    vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_58,1);
    piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_58);
    *piVar2 = 0x37;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0);
  local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_58.member.size;
  local_38[0] = local_58.member.cap;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,unsigned_long>
            ("span.size()","span.capacity()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x113,"void fill_suite::back_inserter_fill_n_full()",&local_80,local_38);
  local_38[0] = 0x3700000037;
  local_38[1] = 0x3700000037;
  __l._M_len = 4;
  __l._M_array = (iterator)local_38;
  std::vector<int,_std::allocator<int>_>::vector(&local_80,__l,&local_81);
  uVar1 = local_58.member.cap * 2;
  uVar3 = uVar1 - (local_58.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar1 - 1 & local_58.member.next - local_58.member.size;
  }
  else {
    uVar4 = (local_58.member.next - local_58.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_60 = uVar1 - 1 & local_58.member.next;
  }
  else {
    sStack_60 = local_58.member.next % uVar1;
  }
  first_end.current = sStack_60;
  first_end.parent = &local_58;
  first_begin.current = uVar4;
  first_begin.parent = &local_58;
  local_68 = &local_58;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x117,"void fill_suite::back_inserter_fill_n_full()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void back_inserter_fill_n_full()
{
    int array[4] = {};
    circular_view<int> span(array);
    std::fill_n(std::back_inserter(span), 2 * span.capacity(), 55);
    BOOST_TEST_EQ(span.size(), span.capacity());
    {
        std::vector<int> expect = { 55, 55, 55, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}